

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O0

Lazy<void>
coro_io::sleep_for<std::chrono::duration<long,std::ratio<1l,1000l>>>
          (duration<long,_std::ratio<1L,_1000L>_> d)

{
  bool bVar1;
  undefined8 *puVar2;
  LazyPromise<void> *this;
  ReadyAwaiter<async_simple::Executor_*> RVar3;
  Executor *pEVar4;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  ReadyAwaiter<async_simple::Executor_*> *this_00;
  undefined8 in_RSI;
  LazyBase<void,_false> in_RDI;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  LazyPromise<void> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int local_184;
  duration<long,_std::ratio<1L,_1000L>_> in_stack_ffffffffffffffa8;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
  *in_stack_ffffffffffffffc8;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffffd0;
  
  puVar2 = (undefined8 *)operator_new(0x88,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<void>::get_return_object_on_allocation_failure();
    return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
  }
  *puVar2 = sleep_for<std::chrono::duration<long,std::ratio<1l,1000l>>>;
  puVar2[1] = sleep_for<std::chrono::duration<long,std::ratio<1l,1000l>>>;
  this_00 = (ReadyAwaiter<async_simple::Executor_*> *)(puVar2 + 10);
  this = (LazyPromise<void> *)(puVar2 + 2);
  puVar2[8] = in_RSI;
  async_simple::coro::detail::LazyPromise<void>::LazyPromise
            ((LazyPromise<void> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  async_simple::coro::detail::LazyPromise<void>::get_return_object(in_stack_fffffffffffffe18);
  async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)this);
  bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x85));
  if (!bVar1) {
    *(undefined1 *)((long)puVar2 + 0x84) = 0;
    sleep_for((void *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
              (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
  }
  std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x85));
  RVar3 = async_simple::coro::detail::LazyPromiseBase::await_transform((LazyPromiseBase *)this);
  this_00->_value = RVar3._value;
  bVar1 = async_simple::coro::ReadyAwaiter<async_simple::Executor_*>::await_ready(this_00);
  if (!bVar1) {
    *(undefined1 *)((long)puVar2 + 0x84) = 1;
    sleep_for((void *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
              (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
  }
  pEVar4 = async_simple::coro::ReadyAwaiter<async_simple::Executor_*>::await_resume(this_00);
  puVar2[9] = pEVar4;
  if (puVar2[9] == 0) {
    std::thread::hardware_concurrency();
    g_io_context_pool<coro_io::io_context_pool>(in_stack_fffffffffffffe24);
    io_context_pool::get_executor
              ((io_context_pool *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    sleep_for<std::chrono::duration<long,std::ratio<1l,1000l>>,coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    async_simple::coro::detail::LazyPromiseBase::await_transform<async_simple::coro::Lazy<void>>
              ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (Lazy<void> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    bVar1 = async_simple::coro::detail::LazyAwaiterBase<void>::await_ready
                      ((LazyAwaiterBase<void> *)(puVar2 + 0xe));
    if (!bVar1) {
      *(undefined1 *)((long)puVar2 + 0x84) = 3;
      sleep_for((void *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                in_stack_fffffffffffffe18);
      (*(code *)*extraout_RAX_00)(extraout_RAX_00);
      return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
    }
    puVar2[7] = (LazyAwaiterBase<void> *)(puVar2 + 0xe);
    async_simple::coro::detail::LazyAwaiterBase<void>::awaitResume
              ((LazyAwaiterBase<void> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    async_simple::coro::detail::LazyBase<void,_false>::ValueAwaiter::~ValueAwaiter
              ((ValueAwaiter *)0x470875);
    async_simple::coro::Lazy<void>::~Lazy((Lazy<void> *)0x470882);
    async_simple::coro::detail::LazyPromise<void>::return_void(this);
    local_184 = 3;
  }
  else {
    async_simple::coro::sleep<long,std::ratio<1l,1000l>>(in_stack_ffffffffffffffa8);
    async_simple::coro::detail::LazyPromiseBase::await_transform<async_simple::coro::Lazy<void>>
              ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (Lazy<void> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    bVar1 = async_simple::coro::detail::LazyAwaiterBase<void>::await_ready
                      ((LazyAwaiterBase<void> *)(puVar2 + 0xc));
    if (!bVar1) {
      *(undefined1 *)((long)puVar2 + 0x84) = 2;
      sleep_for((void *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                in_stack_fffffffffffffe18);
      (*(code *)*extraout_RAX)(extraout_RAX);
      return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
    }
    puVar2[6] = (LazyAwaiterBase<void> *)(puVar2 + 0xc);
    async_simple::coro::detail::LazyAwaiterBase<void>::awaitResume
              ((LazyAwaiterBase<void> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    async_simple::coro::detail::LazyBase<void,_false>::ValueAwaiter::~ValueAwaiter
              ((ValueAwaiter *)0x4706af);
    async_simple::coro::Lazy<void>::~Lazy((Lazy<void> *)0x4706bc);
    local_184 = 0;
  }
  if (local_184 == 0) {
    async_simple::coro::detail::LazyPromise<void>::return_void(this);
  }
  else if (local_184 != 3) goto LAB_00470a5f;
  async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)this);
  bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                    ((FinalAwaiter *)((long)puVar2 + 0x86));
  if (!bVar1) {
    *puVar2 = 0;
    *(undefined1 *)((long)puVar2 + 0x84) = 4;
    sleep_for((void *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
              (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    (*(code *)*extraout_RAX_01)(extraout_RAX_01);
    return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
  }
  async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
            ((FinalAwaiter *)((long)puVar2 + 0x86));
LAB_00470a5f:
  async_simple::coro::detail::LazyPromise<void>::~LazyPromise((LazyPromise<void> *)0x470a77);
  if (puVar2 != (undefined8 *)0x0) {
    operator_delete(puVar2,0x88);
  }
  return (Lazy<void>)in_RDI._coro.__handle_;
}

Assistant:

inline async_simple::coro::Lazy<void> sleep_for(Duration d) {
  if (auto executor = co_await async_simple::CurrentExecutor();
      executor != nullptr) {
    co_await async_simple::coro::sleep(d);
  }
  else {
    co_return co_await sleep_for(d,
                                 coro_io::g_io_context_pool().get_executor());
  }
}